

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

HelicsBool helicsCoreConnect(HelicsCore core,HelicsError *err)

{
  uint uVar1;
  Core *pCVar2;
  Core *cppcore;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  HelicsCore in_stack_ffffffffffffffd8;
  uint local_4;
  
  pCVar2 = getCore(in_stack_ffffffffffffffd8,
                   (HelicsError *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if (pCVar2 == (Core *)0x0) {
    local_4 = 0;
  }
  else {
    uVar1 = (*pCVar2->_vptr_Core[6])();
    local_4 = (uint)((uVar1 & 1) != 0);
  }
  return local_4;
}

Assistant:

HelicsBool helicsCoreConnect(HelicsCore core, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return HELICS_FALSE;
    }

    try {
        return (cppcore->connect()) ? HELICS_TRUE : HELICS_FALSE;
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_FALSE;
    }
    // LCOV_EXCL_STOP
}